

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.c
# Opt level: O2

int jsmn_parse(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,uint num_tokens)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  jsmntok_t *pjVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint local_38;
  
  uVar9 = parser->pos;
  uVar4 = parser->toknext;
  uVar5 = uVar4;
  uVar6 = uVar4;
  local_38 = uVar4;
LAB_001065d6:
  uVar13 = (ulong)uVar4;
  if (uVar9 < len) {
    bVar1 = js[uVar9];
    if (((bVar1 - 9 < 2) || (bVar1 == 0xd)) || (bVar1 == 0x20)) goto LAB_00106897;
    if (bVar1 == 0x22) {
      uVar7 = uVar9 + 1;
      do {
        parser->pos = uVar7;
        if (len <= uVar7) {
LAB_00106a30:
          iVar8 = -3;
          goto LAB_00106a35;
        }
        cVar2 = js[uVar7];
        uVar3 = uVar7;
        if (cVar2 == '\\') {
          uVar11 = uVar7 + 1;
          if (uVar11 < len) {
            parser->pos = uVar11;
            bVar1 = js[uVar11];
            uVar3 = uVar11;
            if ((0x37 < bVar1 - 0x2f) ||
               ((0x88200000000001U >> ((ulong)(bVar1 - 0x2f) & 0x3f) & 1) == 0)) {
              switch(bVar1) {
              case 0x6e:
              case 0x72:
              case 0x74:
                break;
              case 0x6f:
              case 0x70:
              case 0x71:
              case 0x73:
                goto switchD_001067bf_caseD_6f;
              case 0x75:
                parser->pos = uVar7 + 2;
                uVar3 = uVar7 + 3;
                iVar8 = 0;
                while (((iVar8 != -4 && (uVar3 - 1 < len)) && (bVar1 = js[uVar3 - 1], bVar1 != 0)))
                {
                  if ((9 < (byte)(bVar1 - 0x30)) &&
                     ((0x25 < bVar1 - 0x41 ||
                      ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0))))
                  goto switchD_001067bf_caseD_6f;
                  parser->pos = uVar3;
                  iVar8 = iVar8 + -1;
                  uVar3 = uVar3 + 1;
                }
                uVar3 = (uVar7 - iVar8) + 1;
                parser->pos = uVar3;
                break;
              default:
                if (bVar1 != 0x22) goto switchD_001067bf_caseD_6f;
              }
            }
          }
        }
        else {
          if (cVar2 == '\0') goto LAB_00106a30;
          if (cVar2 == '\"') goto LAB_00106971;
        }
        uVar7 = uVar3 + 1;
      } while( true );
    }
    if (bVar1 == 0x2c) {
      if (((tokens != (jsmntok_t *)0x0) && ((long)parser->toksuper != -1)) &&
         (uVar7 = uVar6, 1 < tokens[parser->toksuper].type - JSMN_OBJECT)) {
        do {
          uVar3 = uVar7;
          uVar7 = uVar3 - 1;
          if ((int)uVar7 < 0) goto LAB_00106897;
          uVar11 = uVar7 & 0x7fffffff;
        } while (((1 < tokens[uVar11].type - JSMN_OBJECT) || (tokens[uVar11].start == -1)) ||
                (tokens[uVar11].end != -1));
        parser->toksuper = uVar3 - 1;
      }
      goto LAB_00106897;
    }
    if (bVar1 == 0x3a) {
      parser->toksuper = uVar5 - 1;
      uVar6 = uVar5;
      goto LAB_00106897;
    }
    if (bVar1 == 0x5b) {
LAB_001066ec:
      local_38 = local_38 + 1;
      if (tokens != (jsmntok_t *)0x0) {
        if (num_tokens <= uVar4) {
          return -1;
        }
        uVar5 = uVar4 + 1;
        parser->toknext = uVar5;
        tokens[uVar13].end = -1;
        tokens[uVar13].size = 0;
        if ((long)parser->toksuper != -1) {
          tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
        }
        tokens[uVar13].type = (bVar1 != 0x7b) + JSMN_OBJECT;
        tokens[uVar13].start = uVar9;
        parser->toksuper = uVar4;
        uVar6 = uVar5;
        uVar4 = uVar5;
      }
      goto LAB_00106897;
    }
    if (bVar1 == 0x5d) {
LAB_001066a0:
      if (tokens != (jsmntok_t *)0x0) {
        do {
          uVar12 = uVar13;
          uVar13 = uVar12 - 1;
          if ((int)(uint)uVar13 < 0) goto LAB_001068fc;
          uVar5 = (uint)uVar13 & 0x7fffffff;
        } while ((tokens[uVar5].start == -1) || (pjVar10 = tokens + uVar5, pjVar10->end != -1));
        if (pjVar10->type != (bVar1 != 0x7d) + JSMN_OBJECT) {
          return -2;
        }
        parser->toksuper = -1;
        pjVar10->end = uVar9 + 1;
LAB_001068fc:
        uVar13 = uVar12 - 1;
        if (uVar12 == 0) {
          return -2;
        }
        while (iVar8 = (int)uVar13, uVar5 = uVar4, uVar6 = uVar4, -1 < iVar8) {
          if ((tokens[uVar13 & 0xffffffff].start != -1) && (tokens[uVar13 & 0xffffffff].end == -1))
          {
            parser->toksuper = iVar8;
            break;
          }
          uVar13 = (ulong)(iVar8 - 1);
        }
      }
      goto LAB_00106897;
    }
    if (bVar1 == 0x7b) goto LAB_001066ec;
    if (bVar1 == 0x7d) goto LAB_001066a0;
    uVar7 = uVar9;
    if (bVar1 != 0) {
      while (uVar7 < len) {
        bVar1 = js[uVar7];
        if (((((ulong)bVar1 < 0x3b) && ((0x400100100002601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
            (bVar1 == 0x5d)) || (bVar1 == 0x7d)) break;
        if ((byte)(bVar1 + 0x81) < 0xa1) goto switchD_001067bf_caseD_6f;
        uVar7 = uVar7 + 1;
        parser->pos = uVar7;
      }
      if (tokens == (jsmntok_t *)0x0) {
LAB_00106941:
        uVar9 = uVar7 - 1;
        local_38 = local_38 + 1;
        if ((long)parser->toksuper != -1 && tokens != (jsmntok_t *)0x0) {
          tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
        }
        goto LAB_00106897;
      }
      if (uVar4 < num_tokens) {
        uVar5 = uVar4 + 1;
        parser->toknext = uVar5;
        tokens[uVar13].type = JSMN_PRIMITIVE;
        tokens[uVar13].start = uVar9;
        tokens[uVar13].end = uVar7;
        tokens[uVar13].size = 0;
        uVar6 = uVar5;
        uVar4 = uVar5;
        goto LAB_00106941;
      }
      goto LAB_00106a92;
    }
  }
  uVar5 = local_38;
  if (tokens != (jsmntok_t *)0x0) {
    do {
      uVar13 = uVar13 - 1;
      if ((int)(uint)uVar13 < 0) {
        return local_38;
      }
      uVar9 = (uint)uVar13 & 0x7fffffff;
    } while ((tokens[uVar9].start == -1) || (uVar5 = 0xfffffffd, tokens[uVar9].end != -1));
  }
  return uVar5;
LAB_00106971:
  if (tokens != (jsmntok_t *)0x0) {
    if (num_tokens <= uVar5) {
LAB_00106a92:
      iVar8 = -1;
      goto LAB_00106a35;
    }
    uVar6 = uVar5 + 1;
    parser->toknext = uVar6;
    tokens[uVar5].type = JSMN_STRING;
    tokens[uVar5].start = uVar9 + 1;
    tokens[uVar5].end = uVar7;
    tokens[uVar5].size = 0;
    uVar5 = uVar6;
    uVar4 = uVar6;
  }
  local_38 = local_38 + 1;
  uVar9 = uVar7;
  if ((long)parser->toksuper != -1 && tokens != (jsmntok_t *)0x0) {
    tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
  }
LAB_00106897:
  uVar9 = uVar9 + 1;
  parser->pos = uVar9;
  goto LAB_001065d6;
switchD_001067bf_caseD_6f:
  iVar8 = -2;
LAB_00106a35:
  parser->pos = uVar9;
  return iVar8;
}

Assistant:

int jsmn_parse(jsmn_parser *parser, const char *js, size_t len,
		jsmntok_t *tokens, unsigned int num_tokens) {
	int r;
	int i;
	jsmntok_t *token;
	int count = parser->toknext;

	for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
		char c;
		jsmntype_t type;

		c = js[parser->pos];
		switch (c) {
			case '{': case '[':
				count++;
				if (tokens == NULL) {
					break;
				}
				token = jsmn_alloc_token(parser, tokens, num_tokens);
				if (token == NULL)
					return JSMN_ERROR_NOMEM;
				if (parser->toksuper != -1) {
					tokens[parser->toksuper].size++;
#ifdef JSMN_PARENT_LINKS
					token->parent = parser->toksuper;
#endif
				}
				token->type = (c == '{' ? JSMN_OBJECT : JSMN_ARRAY);
				token->start = parser->pos;
				parser->toksuper = parser->toknext - 1;
				break;
			case '}': case ']':
				if (tokens == NULL)
					break;
				type = (c == '}' ? JSMN_OBJECT : JSMN_ARRAY);
#ifdef JSMN_PARENT_LINKS
				if (parser->toknext < 1) {
					return JSMN_ERROR_INVAL;
				}
				token = &tokens[parser->toknext - 1];
				for (;;) {
					if (token->start != -1 && token->end == -1) {
						if (token->type != type) {
							return JSMN_ERROR_INVAL;
						}
						token->end = parser->pos + 1;
						parser->toksuper = token->parent;
						break;
					}
					if (token->parent == -1) {
						break;
					}
					token = &tokens[token->parent];
				}
#else
				for (i = parser->toknext - 1; i >= 0; i--) {
					token = &tokens[i];
					if (token->start != -1 && token->end == -1) {
						if (token->type != type) {
							return JSMN_ERROR_INVAL;
						}
						parser->toksuper = -1;
						token->end = parser->pos + 1;
						break;
					}
				}
				/* Error if unmatched closing bracket */
				if (i == -1) return JSMN_ERROR_INVAL;
				for (; i >= 0; i--) {
					token = &tokens[i];
					if (token->start != -1 && token->end == -1) {
						parser->toksuper = i;
						break;
					}
				}
#endif
				break;
			case '\"':
				r = jsmn_parse_string(parser, js, len, tokens, num_tokens);
				if (r < 0) return r;
				count++;
				if (parser->toksuper != -1 && tokens != NULL)
					tokens[parser->toksuper].size++;
				break;
			case '\t' : case '\r' : case '\n' : case ' ':
				break;
			case ':':
				parser->toksuper = parser->toknext - 1;
				break;
			case ',':
				if (tokens != NULL && parser->toksuper != -1 &&
						tokens[parser->toksuper].type != JSMN_ARRAY &&
						tokens[parser->toksuper].type != JSMN_OBJECT) {
#ifdef JSMN_PARENT_LINKS
					parser->toksuper = tokens[parser->toksuper].parent;
#else
					for (i = parser->toknext - 1; i >= 0; i--) {
						if (tokens[i].type == JSMN_ARRAY || tokens[i].type == JSMN_OBJECT) {
							if (tokens[i].start != -1 && tokens[i].end == -1) {
								parser->toksuper = i;
								break;
							}
						}
					}
#endif
				}
				break;
#ifdef JSMN_STRICT
			/* In strict mode primitives are: numbers and booleans */
			case '-': case '0': case '1' : case '2': case '3' : case '4':
			case '5': case '6': case '7' : case '8': case '9':
			case 't': case 'f': case 'n' :
				/* And they must not be keys of the object */
				if (tokens != NULL && parser->toksuper != -1) {
					jsmntok_t *t = &tokens[parser->toksuper];
					if (t->type == JSMN_OBJECT ||
							(t->type == JSMN_STRING && t->size != 0)) {
						return JSMN_ERROR_INVAL;
					}
				}
#else
			/* In non-strict mode every unquoted value is a primitive */
			default:
#endif
				r = jsmn_parse_primitive(parser, js, len, tokens, num_tokens);
				if (r < 0) return r;
				count++;
				if (parser->toksuper != -1 && tokens != NULL)
					tokens[parser->toksuper].size++;
				break;

#ifdef JSMN_STRICT
			/* Unexpected char in strict mode */
			default:
				return JSMN_ERROR_INVAL;
#endif
		}
	}

	if (tokens != NULL) {
		for (i = parser->toknext - 1; i >= 0; i--) {
			/* Unmatched opened object or array */
			if (tokens[i].start != -1 && tokens[i].end == -1) {
				return JSMN_ERROR_PART;
			}
		}
	}

	return count;
}